

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

void __thiscall crnlib::dxt_image::clear(dxt_image *this)

{
  dxt_image *this_local;
  
  vector<crnlib::dxt_image::element>::clear(&this->m_elements);
  this->m_width = 0;
  this->m_height = 0;
  this->m_blocks_x = 0;
  this->m_blocks_y = 0;
  this->m_num_elements_per_block = 0;
  this->m_bytes_per_block = 0;
  this->m_format = cDXTInvalid;
  utils::zero_object<crnlib::dxt_image::element_type[2]>(&this->m_element_type);
  utils::zero_object<signed_char[2]>(&this->m_element_component_index);
  this->m_total_blocks = 0;
  this->m_total_elements = 0;
  this->m_pElements = (element *)0x0;
  return;
}

Assistant:

void dxt_image::clear()
    {
        m_elements.clear();
        m_width = 0;
        m_height = 0;
        m_blocks_x = 0;
        m_blocks_y = 0;
        m_num_elements_per_block = 0;
        m_bytes_per_block = 0;
        m_format = cDXTInvalid;
        utils::zero_object(m_element_type);
        utils::zero_object(m_element_component_index);
        m_total_blocks = 0;
        m_total_elements = 0;
        m_pElements = nullptr;
    }